

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmGlobalGenerator *pcVar4;
  pointer pcVar5;
  cmGeneratorTarget *this_00;
  size_type sVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *implicitDirs;
  bool bVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  cmMakefile *pcVar10;
  cmLocalGenerator *pcVar11;
  cmState *this_01;
  cmOrderDirectories *pcVar12;
  char *pcVar13;
  _Alloc_hider __v;
  string loader_flag_var;
  string rlVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string local_158;
  string local_138;
  string local_118;
  string *local_f0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  p_Var1 = &(this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Target = target;
  pcVar10 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar10;
  pcVar11 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar4 = pcVar11->GlobalGenerator;
  this->GlobalGenerator = pcVar4;
  this->CMakeInstance = pcVar4->CMakeInstance;
  local_38 = &this->Config;
  local_88 = &(this->Config).field_2;
  (this->Config)._M_dataplus._M_p = (pointer)local_88;
  pcVar5 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar5,pcVar5 + config->_M_string_length);
  local_f0 = &this->LinkLanguage;
  local_90 = &(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)local_90;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->LibLinkFlag).field_2;
  (this->LibLinkFlag)._M_dataplus._M_p = (pointer)local_98;
  (this->LibLinkFlag)._M_string_length = 0;
  (this->LibLinkFlag).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->LibLinkFileFlag).field_2;
  (this->LibLinkFileFlag)._M_dataplus._M_p = (pointer)local_a0;
  (this->LibLinkFileFlag)._M_string_length = 0;
  (this->LibLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_a8 = &(this->LibLinkSuffix).field_2;
  (this->LibLinkSuffix)._M_dataplus._M_p = (pointer)local_a8;
  (this->LibLinkSuffix)._M_string_length = 0;
  (this->LibLinkSuffix).field_2._M_local_buf[0] = '\0';
  local_b0 = &(this->RuntimeFlag).field_2;
  (this->RuntimeFlag)._M_dataplus._M_p = (pointer)local_b0;
  (this->RuntimeFlag)._M_string_length = 0;
  (this->RuntimeFlag).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->RuntimeSep).field_2;
  (this->RuntimeSep)._M_dataplus._M_p = (pointer)local_b8;
  (this->RuntimeSep)._M_string_length = 0;
  (this->RuntimeSep).field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->RuntimeAlways).field_2;
  (this->RuntimeAlways)._M_dataplus._M_p = (pointer)local_c0;
  (this->RuntimeAlways)._M_string_length = 0;
  (this->RuntimeAlways).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->RPathLinkFlag).field_2;
  (this->RPathLinkFlag)._M_dataplus._M_p = (pointer)local_c8;
  (this->RPathLinkFlag)._M_string_length = 0;
  (this->RPathLinkFlag).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->StaticLinkTypeFlag).field_2;
  (this->StaticLinkTypeFlag)._M_dataplus._M_p = (pointer)local_d0;
  (this->StaticLinkTypeFlag)._M_string_length = 0;
  (this->StaticLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  local_d8 = &(this->SharedLinkTypeFlag).field_2;
  (this->SharedLinkTypeFlag)._M_dataplus._M_p = (pointer)local_d8;
  (this->SharedLinkTypeFlag)._M_string_length = 0;
  (this->SharedLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtractStaticLibraryName).regmatch.endp[0] = (char *)0x0;
  (this->ExtractStaticLibraryName).regmatch.searchstring = (char *)0x0;
  (this->ExtractStaticLibraryName).program = (char *)0x0;
  (this->ExtractSharedLibraryName).regmatch.startp[0] = (char *)0x0;
  (this->ExtractSharedLibraryName).regmatch.endp[0] = (char *)0x0;
  (this->ExtractSharedLibraryName).regmatch.searchstring = (char *)0x0;
  (this->ExtractSharedLibraryName).program = (char *)0x0;
  (this->ExtractAnyLibraryName).regmatch.startp[0] = (char *)0x0;
  (this->ExtractAnyLibraryName).regmatch.endp[0] = (char *)0x0;
  (this->ExtractAnyLibraryName).regmatch.searchstring = (char *)0x0;
  (this->ExtractAnyLibraryName).program = (char *)0x0;
  local_e0 = &(this->SharedRegexString).field_2;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ExtractStaticLibraryName).regmatch.startp[0] = (char *)0x0;
  (this->SharedRegexString)._M_dataplus._M_p = (pointer)local_e0;
  (this->SharedRegexString)._M_string_length = 0;
  (this->SharedRegexString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SplitFramework).regmatch.endp[0] = (char *)0x0;
  (this->SplitFramework).regmatch.searchstring = (char *)0x0;
  (this->SplitFramework).program = (char *)0x0;
  p_Var1 = &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SplitFramework).regmatch.startp[0] = (char *)0x0;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var2 = &(this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  local_40 = (string *)&this->LibLinkFlag;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = (string *)&this->LibLinkFileFlag;
  local_50 = (string *)&this->LibLinkSuffix;
  local_68 = (string *)&this->RuntimeFlag;
  local_70 = (string *)&this->RuntimeSep;
  local_78 = (string *)&this->RuntimeAlways;
  local_80 = (string *)&this->RPathLinkFlag;
  local_58 = &this->ImplicitLinkDirs;
  local_60 = &this->RuntimeLinkDirs;
  local_e8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->OldLinkDirMask;
  this_01 = cmMakefile::GetState(this->Makefile);
  paVar3 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar7 = cmState::GetGlobalPropertyAsBool(this_01,&local_158);
  this->OpenBSD = bVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar3) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar12,this->GlobalGenerator,target,"linker search path");
  this->OrderLinkerSearchPath = pcVar12;
  pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar12,this->GlobalGenerator,target,"runtime search path")
  ;
  this->OrderRuntimeSearchPath = pcVar12;
  this->OrderDependentRPath = (cmOrderDirectories *)0x0;
  cmGeneratorTarget::GetLinkerLanguage(&local_158,this->Target,config);
  std::__cxx11::string::operator=((string *)local_f0,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar3) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((this->LinkLanguage)._M_string_length != 0) {
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    bVar7 = cmMakefile::IsDefinitionSet(pcVar10,&local_158);
    this->UseImportLibrary = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->Target;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"LINK_DEPENDS_NO_SHARED","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_158);
    this->LinkDependsNoShared = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    this->LoaderFlag = (char *)0x0;
    if ((this->UseImportLibrary == false) &&
       (TVar8 = cmGeneratorTarget::GetType(this->Target), TVar8 == MODULE_LIBRARY)) {
      local_158._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_SHARED_MODULE_LOADER_","");
      std::__cxx11::string::_M_append
                ((char *)&local_158,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_158);
      pcVar13 = cmMakefile::GetDefinition(this->Makefile,&local_158);
      this->LoaderFlag = pcVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_LINK_LIBRARY_FLAG","");
    cmMakefile::GetSafeDefinition(pcVar10,&local_158);
    std::__cxx11::string::_M_assign(local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_LINK_LIBRARY_FILE_FLAG","");
    cmMakefile::GetSafeDefinition(pcVar10,&local_158);
    std::__cxx11::string::_M_assign(local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_LINK_LIBRARY_SUFFIX","");
    cmMakefile::GetSafeDefinition(pcVar10,&local_158);
    std::__cxx11::string::_M_assign(local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    this->RuntimeUseChrpath = false;
    TVar8 = cmGeneratorTarget::GetType(this->Target);
    if (TVar8 != STATIC_LIBRARY) {
      cmGeneratorTarget::GetType(this->Target);
      local_158._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"CMAKE_","");
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append
                ((char *)&local_158,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_158);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      std::__cxx11::string::append((char *)&local_118);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_158);
      std::__cxx11::string::_M_assign(local_68);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_assign(local_70);
      pcVar10 = this->Makefile;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH","");
      cmMakefile::GetSafeDefinition(pcVar10,&local_138);
      std::__cxx11::string::_M_assign(local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      bVar7 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
      this->RuntimeUseChrpath = bVar7;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_","");
      std::__cxx11::string::append((char *)&local_138);
      std::__cxx11::string::append((char *)&local_138);
      std::__cxx11::string::_M_append
                ((char *)&local_138,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_138);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
      std::__cxx11::string::_M_assign(local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_SHARED_LIBRARY_LINK_","");
    std::__cxx11::string::_M_append((char *)&local_158,(ulong)(this->LinkLanguage)._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)&local_158);
    bVar7 = cmMakefile::IsOn(this->Makefile,&local_158);
    this->LinkWithRuntimePath = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME","");
    bVar7 = cmMakefile::IsOn(pcVar10,&local_158);
    this->NoSONameUsesPath = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES","");
    bVar7 = cmMakefile::IsOn(pcVar10,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar10 = this->Makefile;
      local_158._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS","");
      bVar7 = cmMakefile::IsOn(pcVar10,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else if ((this->RPathLinkFlag)._M_string_length != 0) {
        this->SharedDependencyMode = SharedDepModeDir;
        pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
        cmOrderDirectories::cmOrderDirectories
                  (pcVar12,this->GlobalGenerator,target,"dependent library path");
        this->OrderDependentRPath = pcVar12;
      }
    }
    implicitDirs = local_58;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkDirectories
              (this->Target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118,config,local_f0);
    cmOrderDirectories::AddUserDirectories
              (this->OrderLinkerSearchPath,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118);
    cmOrderDirectories::AddUserDirectories
              (this->OrderRuntimeSearchPath,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories(this->OrderLinkerSearchPath,implicitDirs);
    cmOrderDirectories::SetImplicitDirectories(this->OrderRuntimeSearchPath,implicitDirs);
    if (this->OrderDependentRPath != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(this->OrderDependentRPath,implicitDirs);
      cmOrderDirectories::AddLanguageDirectories(this->OrderDependentRPath,local_60);
    }
    PVar9 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0003);
    sVar6 = local_118._M_string_length;
    this->OldLinkDirMode = PVar9 != NEW;
    if ((PVar9 != NEW) &&
       (local_158._M_dataplus._M_p = (pointer)local_e8,
       local_118._M_dataplus._M_p != (pointer)local_118._M_string_length)) {
      __v._M_p = local_118._M_dataplus._M_p;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  (local_e8,(const_iterator)p_Var1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v._M_p,
                   (_Alloc_node *)&local_158);
        __v._M_p = __v._M_p + 0x20;
      } while (__v._M_p != (pointer)sVar6);
    }
    pcVar10 = this->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_POLICY_WARNING_CMP0060","");
    bVar7 = cmMakefile::PolicyOptionalWarningEnabled(pcVar10,&local_158);
    this->CMP0060Warn = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
  // Store context information.
  : Target(target)
  , Makefile(target->Target->GetMakefile())
  , GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator())
  , CMakeInstance(this->GlobalGenerator->GetCMakeInstance())
  // The configuration being linked.
  , Config(config)
{
  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // Allocate internals.
  this->OrderLinkerSearchPath = new cmOrderDirectories(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = new cmOrderDirectories(
    this->GlobalGenerator, target, "runtime search path");
  this->OrderDependentRPath = nullptr;

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should use an import library for linking a target.
  this->UseImportLibrary =
    this->Makefile->IsDefinitionSet("CMAKE_IMPORT_LIBRARY_SUFFIX");

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  this->LoaderFlag = nullptr;
  if (!this->UseImportLibrary &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var = "CMAKE_SHARED_MODULE_LOADER_";
    loader_flag_var += this->LinkLanguage;
    loader_flag_var += "_FLAG";
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  this->LibLinkFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  this->LibLinkFileFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  this->LibLinkSuffix =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar = "CMAKE_";
    rtVar += tType;
    rtVar += "_RUNTIME_";
    rtVar += this->LinkLanguage;
    rtVar += "_FLAG";
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar = "CMAKE_";
    rlVar += tType;
    rlVar += "_RPATH_LINK_";
    rlVar += this->LinkLanguage;
    rlVar += "_FLAG";
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = "CMAKE_SHARED_LIBRARY_LINK_";
    var += this->LinkLanguage;
    var += "_WITH_RUNTIME_PATH";
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = new cmOrderDirectories(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  std::vector<std::string> directories;
  this->Target->GetLinkDirectories(directories, config, this->LinkLanguage);
  this->OrderLinkerSearchPath->AddUserDirectories(directories);
  this->OrderRuntimeSearchPath->AddUserDirectories(directories);

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    this->OldLinkDirMask.insert(directories.begin(), directories.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}